

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::tUngotTokenInput::scan(tUngotTokenInput *this,TPpToken *ppToken)

{
  int ret;
  TPpToken *ppToken_local;
  tUngotTokenInput *this_local;
  
  if (((this->super_tInput).done & 1U) == 0) {
    this_local._4_4_ = this->token;
    memcpy(ppToken,&this->lval,0x429);
    (this->super_tInput).done = true;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::tUngotTokenInput::scan(TPpToken* ppToken)
{
    if (done)
        return EndOfInput;

    int ret = token;
    *ppToken = lval;
    done = true;

    return ret;
}